

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::create_group_ops(ConvolutionDepthWise_x86_avx *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  long *plVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int i;
  uint uVar11;
  pointer ppLVar12;
  _func_int *p_Var13;
  Layer *pLVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  pointer ppLVar18;
  long lVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [32];
  undefined1 auVar24 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar36 [16];
  undefined1 in_ZMM11 [64];
  ParamDict pd;
  Mat local_328;
  Allocator *local_2d8;
  int *local_2d0;
  size_t local_2c8;
  uint local_2c0;
  Allocator *local_2b8;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  uint local_2a0;
  size_t local_298;
  int local_28c;
  void *local_288;
  int *piStack_280;
  size_t local_278;
  int local_270;
  Allocator *local_268;
  int local_260;
  int iStack_25c;
  undefined8 uStack_258;
  int local_250;
  size_t local_248;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_240;
  Allocator *local_238;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 local_228;
  undefined4 uStack_224;
  uint local_220;
  undefined1 auStack_21c [4];
  Allocator *local_218;
  uint uStack_210;
  int iStack_20c;
  uint uStack_208;
  uint uStack_204;
  uint uStack_200;
  undefined1 auStack_1fc [4];
  size_t local_1f8;
  Mat local_1e8;
  Allocator *local_1a0;
  int *piStack_198;
  size_t local_190;
  uint local_188;
  Allocator *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  uint local_168;
  size_t local_160;
  Allocator *local_158;
  int *piStack_150;
  size_t local_148;
  uint local_140;
  Allocator *local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  uint local_120;
  size_t local_118;
  Allocator *local_110;
  int *piStack_108;
  size_t sStack_100;
  uint uStack_f8;
  Allocator *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  uint local_d8;
  size_t local_d0;
  Allocator *local_c8;
  int *piStack_c0;
  size_t sStack_b8;
  uint uStack_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  uint local_90;
  size_t local_88;
  size_t local_78;
  undefined1 *local_70;
  size_t local_68;
  Option *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ParamDict local_40;
  
  ppLVar18 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar17 = *(int *)(&this->field_0xd8 + (long)p_Var13) * *(int *)(&this->field_0xd4 + (long)p_Var13)
  ;
  iVar2 = *(int *)(&this->field_0xd0 + (long)p_Var13);
  iVar3 = *(int *)(&this->field_0x108 + (long)p_Var13);
  uVar16 = (long)*(int *)(&this->field_0x104 + (long)p_Var13) / (long)iVar3;
  uVar16 = (long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) / (long)iVar17;
  ppLVar12 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_60 = opt;
  if (0 < (int)((ulong)((long)ppLVar12 - (long)ppLVar18) >> 3)) {
    lVar19 = 0;
    do {
      if (ppLVar18[lVar19] != (Layer *)0x0) {
        (*ppLVar18[lVar19]->_vptr_Layer[1])();
        ppLVar18 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppLVar12 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < (int)((ulong)((long)ppLVar12 - (long)ppLVar18) >> 3));
  }
  local_240 = &this->group_ops;
  if (ppLVar12 != ppLVar18) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar18;
  }
  iVar4 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  i = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_240,(long)iVar4);
  if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3])) {
    local_70 = &this->field_0x118;
    local_28c = iVar17 * i *
                (((int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_68 = (size_t)local_28c;
    local_78 = (size_t)i;
    p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
    lVar19 = 0;
    local_58 = 0x8000000000000000;
    uStack_50 = 0x8000000000000000;
    do {
      auVar36 = in_ZMM11._0_16_;
      auVar35 = in_ZMM10._0_16_;
      local_278 = *(size_t *)(&this->field_0x178 + (long)p_Var13);
      local_288 = (void *)(lVar19 * local_68 * local_278 +
                          *(long *)(&this->field_0x168 + (long)p_Var13));
      local_270 = *(int *)(&this->field_0x180 + (long)p_Var13);
      local_268 = *(Allocator **)(&this->field_0x188 + (long)p_Var13);
      piStack_280 = (int *)0x0;
      local_260 = 1;
      iStack_25c = (int)local_68;
      uStack_258._0_4_ = 1;
      uStack_258._4_4_ = 1;
      local_250 = 1;
      local_248 = local_68;
      local_1f8 = 0;
      local_238 = (Allocator *)0x0;
      local_228 = 0;
      uStack_224 = 0;
      local_220 = 0;
      local_218 = (Allocator *)0x0;
      iStack_20c = 0;
      bVar20 = *(int *)(&this->field_0x100 + (long)p_Var13) != 0;
      if (bVar20) {
        local_218 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var13);
        local_220 = *(uint *)(&this->field_0x1c8 + (long)p_Var13);
        lVar15 = *(long *)(&this->field_0x1c0 + (long)p_Var13);
        local_238 = (Allocator *)
                    (lVar19 * local_78 * lVar15 + *(long *)(&this->field_0x1b0 + (long)p_Var13));
        local_228 = (undefined4)lVar15;
        uStack_224 = (undefined4)((ulong)lVar15 >> 0x20);
        local_1f8 = local_78;
        iStack_20c = i;
      }
      uStack_200 = (uint)bVar20;
      uStack_204 = (uint)bVar20;
      uStack_208 = (uint)bVar20;
      uStack_210 = (uint)bVar20;
      uStack_22c = 0;
      uStack_230 = 0;
      pLVar14 = create_layer(6);
      ParamDict::ParamDict(&local_40);
      ParamDict::set(&local_40,0,i);
      ParamDict::set(&local_40,1,
                     *(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,0xb,
                     *(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,2,
                     *(int *)(&this->field_0xdc + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,0xc,
                     *(int *)(&this->field_0xe0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,3,
                     *(int *)(&this->field_0xe4 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,0xd,
                     *(int *)(&this->field_0xe8 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,4,0);
      ParamDict::set(&local_40,0xe,0);
      ParamDict::set(&local_40,5,
                     *(int *)(&this->field_0x100 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
      ParamDict::set(&local_40,6,local_28c);
      ParamDict::set(&local_40,8,
                     *(int *)(&this->field_0x10c +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
      ParamDict::set(&local_40,9,
                     *(int *)(&this->field_0x110 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
      ParamDict::set(&local_40,10,
                     (Mat *)(local_70 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
      (*pLVar14->_vptr_Layer[2])(pLVar14,&local_40);
      if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) == 0) {
        lVar15 = 0x40;
        auVar22._0_12_ = ZEXT812(0);
        auVar22._12_4_ = 0;
        do {
          *(undefined8 *)((long)&local_1e8.data + lVar15) = 0;
          *(undefined1 (*) [16])((long)&local_228 + lVar15) = auVar22;
          *(undefined1 (*) [16])(auStack_21c + lVar15) = auVar22;
          *(undefined1 (*) [16])((long)&uStack_208 + lVar15) = auVar22;
          *(undefined1 (*) [16])(auStack_1fc + lVar15) = auVar22;
          lVar15 = lVar15 + 0x48;
        } while (lVar15 != 0x160);
        if (local_1e8.refcount != (int *)0x0) {
          LOCK();
          *local_1e8.refcount = *local_1e8.refcount + -1;
          UNLOCK();
          if (*local_1e8.refcount == 0) {
            if (local_1e8.allocator == (Allocator *)0x0) {
              if (local_1e8.data != (void *)0x0) {
                free(local_1e8.data);
              }
            }
            else {
              (*(local_1e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_1e8.data = local_288;
        local_1e8.refcount = piStack_280;
        local_1e8.elemsize = local_278;
        local_1e8.elempack = local_270;
        local_1e8.allocator = local_268;
        local_1e8.w = iStack_25c;
        local_1e8.dims = local_260;
        local_1e8.h = (int)uStack_258;
        local_1e8.d = uStack_258._4_4_;
        local_1e8.c = local_250;
        local_1e8.cstep = local_248;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) != 0)
        {
          local_328.cstep = 0;
          local_328.data = (Allocator *)0x0;
          local_328.refcount._0_4_ = 0;
          local_328.refcount._4_4_ = 0;
          local_328.elemsize = 0;
          local_328.elempack = 0;
          local_328.h = 0;
          local_328.allocator = (Allocator *)local_328.data;
          local_328.dims = (int)local_328.refcount;
          local_328.w = local_328.elempack;
          local_328.d = (int)local_328.refcount;
          local_328.c = local_328.elempack;
          Mat::create(&local_328,i,4,(Allocator *)0x0);
          auVar10 = _DAT_00316320;
          auVar9 = _DAT_00316300;
          uVar11 = local_328.c * (int)local_328.cstep;
          auVar8._8_8_ = uStack_50;
          auVar8._0_8_ = local_58;
          auVar35 = vpcmpeqd_avx(auVar35,auVar35);
          if (0 < (int)uVar11) {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = (ulong)uVar11 - 1;
            auVar22 = vpshufd_avx(auVar24,0x44);
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) + lVar19 * 4);
            auVar26._4_4_ = uVar1;
            auVar26._0_4_ = uVar1;
            auVar26._8_4_ = uVar1;
            auVar26._12_4_ = uVar1;
            auVar26._16_4_ = uVar1;
            auVar26._20_4_ = uVar1;
            auVar26._24_4_ = uVar1;
            auVar26._28_4_ = uVar1;
            uVar16 = 0;
            do {
              auVar28._8_8_ = 0;
              auVar28._0_8_ = uVar16;
              auVar24 = vpshufd_avx(auVar28,0x44);
              auVar31._16_16_ = auVar24;
              auVar31._0_16_ = auVar24;
              auVar32 = vorps_avx(auVar31,auVar9);
              auVar31 = vorps_avx(auVar10,auVar31);
              auVar24 = vpcmpgtq_avx(auVar8 ^ auVar31._16_16_,auVar8 ^ auVar22);
              auVar28 = vpcmpgtq_avx(auVar8 ^ auVar31._0_16_,auVar8 ^ auVar22);
              auVar24 = vpackssdw_avx(auVar28,auVar24);
              auVar28 = vpcmpgtq_avx(auVar8 ^ auVar32._16_16_,auVar8 ^ auVar22);
              auVar34._0_4_ = (uint)local_58 ^ auVar32._0_4_;
              auVar34._4_4_ = (uint)((ulong)local_58 >> 0x20) ^ auVar32._4_4_;
              auVar34._8_4_ = (uint)uStack_50 ^ auVar32._8_4_;
              auVar34._12_4_ = (uint)((ulong)uStack_50 >> 0x20) ^ auVar32._12_4_;
              auVar34 = vpcmpgtq_avx(auVar34,auVar8 ^ auVar22);
              auVar28 = vpackssdw_avx(auVar34,auVar28);
              auVar24 = vpackssdw_avx(auVar35 ^ auVar28,auVar35 ^ auVar24);
              auVar28 = vpmovsxwd_avx(auVar24);
              auVar24 = vpunpckhwd_avx(auVar24,auVar24);
              auVar32._16_16_ = auVar24;
              auVar32._0_16_ = auVar28;
              auVar32 = vmaskmovps_avx(auVar32,auVar26);
              *(undefined1 (*) [32])((long)(_func_int ***)local_328.data + uVar16 * 4) = auVar32;
              uVar16 = uVar16 + 8;
            } while ((uVar11 + 7 & 0xfffffff8) != uVar16);
          }
          piVar5 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          if (piStack_198 != (int *)0x0) {
            LOCK();
            *piStack_198 = *piStack_198 + -1;
            UNLOCK();
            if (*piStack_198 == 0) {
              if (local_180 == (Allocator *)0x0) {
                if (local_1a0 != (Allocator *)0x0) {
                  free(local_1a0);
                }
              }
              else {
                (*local_180->_vptr_Allocator[3])();
              }
            }
          }
          piStack_198 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
          local_1a0 = (Allocator *)local_328.data;
          local_190 = local_328.elemsize;
          local_188 = local_328.elempack;
          local_180 = local_328.allocator;
          local_178 = CONCAT44(local_328.w,local_328.dims);
          uStack_170 = CONCAT44(local_328.d,local_328.h);
          local_168 = local_328.c;
          local_160 = local_328.cstep;
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          local_2c8 = *(size_t *)(&this->field_0x250 + (long)p_Var13);
          local_2d8 = (Allocator *)
                      (local_2c8 * lVar19 + *(long *)(&this->field_0x240 + (long)p_Var13));
          local_2c0 = *(uint *)(&this->field_0x258 + (long)p_Var13);
          local_2b8 = *(Allocator **)(&this->field_0x260 + (long)p_Var13);
          local_2d0 = (int *)0x0;
          local_2b0 = 1;
          uStack_2ac = 1;
          uStack_2a8 = 1;
          uStack_2a4 = 1;
          local_2a0 = 1;
          local_298 = 1;
          if (piStack_150 != (int *)0x0) {
            LOCK();
            *piStack_150 = *piStack_150 + -1;
            UNLOCK();
            if (*piStack_150 == 0) {
              if (local_138 == (Allocator *)0x0) {
                if (local_158 != (Allocator *)0x0) {
                  free(local_158);
                }
              }
              else {
                (*local_138->_vptr_Allocator[3])();
              }
            }
          }
          local_158 = local_2d8;
          piStack_150 = local_2d0;
          local_148 = local_2c8;
          local_140 = local_2c0;
          local_138 = local_2b8;
          local_130 = CONCAT44(uStack_2ac,local_2b0);
          uStack_128 = CONCAT44(uStack_2a4,uStack_2a8);
          local_120 = local_2a0;
          local_118 = local_298;
          if (local_2d0 != (int *)0x0) {
            LOCK();
            *local_2d0 = *local_2d0 + -1;
            UNLOCK();
            if (*local_2d0 == 0) {
              if (local_2b8 == (Allocator *)0x0) {
                if (local_2d8 != (Allocator *)0x0) {
                  free(local_2d8);
                }
              }
              else {
                (*local_2b8->_vptr_Allocator[3])();
              }
            }
          }
          piVar5 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_328.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_328.data != (Allocator *)0x0) {
                  free(local_328.data);
                }
              }
              else {
                (*(local_328.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          if (100 < *(int *)(&this->field_0x10c + (long)p_Var13)) {
            local_328.elemsize = *(size_t *)(&this->field_0x298 + (long)p_Var13);
            local_328.data =
                 (void *)(local_328.elemsize * lVar19 +
                         *(long *)(&this->field_0x288 + (long)p_Var13));
            local_328.elempack = *(int *)(&this->field_0x2a0 + (long)p_Var13);
            local_328.allocator = *(Allocator **)(&this->field_0x2a8 + (long)p_Var13);
            local_328.refcount._0_4_ = 0;
            local_328.refcount._4_4_ = 0;
            local_328.dims = 1;
            local_328.w = 1;
            local_328.h = 1;
            local_328.d = 1;
            local_328.c = 1;
            local_328.cstep = 1;
            if (piStack_108 != (int *)0x0) {
              LOCK();
              *piStack_108 = *piStack_108 + -1;
              UNLOCK();
              if (*piStack_108 == 0) {
                if (local_f0 == (Allocator *)0x0) {
                  if (local_110 != (Allocator *)0x0) {
                    free(local_110);
                  }
                }
                else {
                  (*local_f0->_vptr_Allocator[3])();
                }
              }
            }
            piVar5 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
            local_110 = (Allocator *)local_328.data;
            piStack_108 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
            sStack_100 = local_328.elemsize;
            uStack_f8 = local_328.elempack;
            local_f0 = local_328.allocator;
            local_e8 = CONCAT44(local_328.w,local_328.dims);
            uStack_e0 = CONCAT44(local_328.d,local_328.h);
            local_d8 = local_328.c;
            local_d0 = local_328.cstep;
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_328.allocator == (Allocator *)0x0) {
                  if ((Allocator *)local_328.data != (Allocator *)0x0) {
                    free(local_328.data);
                  }
                }
                else {
                  (*(local_328.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
        }
        in_ZMM10 = ZEXT1664(auVar35);
        in_ZMM11 = ZEXT1664(auVar36);
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_328,&local_1e8);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_328);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_328);
        lVar15 = 0xd8;
        do {
          piVar5 = *(int **)((long)&local_1e8.refcount + lVar15);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar6 = *(void **)((long)&local_1e8.data + lVar15);
              plVar7 = *(long **)((long)&local_1e8.allocator + lVar15);
              if (plVar7 == (long *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (**(code **)(*plVar7 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_1e8.cstep + lVar15) = 0;
          *(undefined8 *)((long)&local_1e8.refcount + lVar15 + 4) = 0;
          *(undefined8 *)((long)&local_1e8.elemsize + lVar15 + 4) = 0;
          *(undefined8 *)((long)&local_1e8.data + lVar15) = 0;
          *(undefined8 *)((long)&local_1e8.refcount + lVar15) = 0;
          *(undefined8 *)((long)&local_1e8.dims + lVar15) = 0;
          *(undefined8 *)((long)&local_1e8.h + lVar15) = 0;
          *(undefined4 *)((long)&local_1e8.c + lVar15) = 0;
          lVar15 = lVar15 + -0x48;
        } while (lVar15 != -0x48);
      }
      else {
        lVar15 = 0x40;
        auVar21._0_12_ = ZEXT812(0);
        auVar21._12_4_ = 0;
        do {
          *(undefined8 *)((long)&local_1e8.data + lVar15) = 0;
          *(undefined1 (*) [16])((long)&local_228 + lVar15) = auVar21;
          *(undefined1 (*) [16])(auStack_21c + lVar15) = auVar21;
          *(undefined1 (*) [16])((long)&uStack_208 + lVar15) = auVar21;
          *(undefined1 (*) [16])(auStack_1fc + lVar15) = auVar21;
          lVar15 = lVar15 + 0x48;
        } while (lVar15 != 0x1a8);
        if (local_1e8.refcount != (int *)0x0) {
          LOCK();
          *local_1e8.refcount = *local_1e8.refcount + -1;
          UNLOCK();
          if (*local_1e8.refcount == 0) {
            if (local_1e8.allocator == (Allocator *)0x0) {
              if (local_1e8.data != (void *)0x0) {
                free(local_1e8.data);
              }
            }
            else {
              (*(local_1e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_1e8.data = local_288;
        local_1e8.refcount = piStack_280;
        local_1e8.elemsize = local_278;
        local_1e8.elempack = local_270;
        local_1e8.allocator = local_268;
        local_1e8.w = iStack_25c;
        local_1e8.dims = local_260;
        local_1e8.h = (int)uStack_258;
        local_1e8.d = uStack_258._4_4_;
        local_1e8.c = local_250;
        local_1e8.cstep = local_248;
        piVar5 = (int *)CONCAT44(uStack_22c,uStack_230);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        if (piStack_198 != (int *)0x0) {
          LOCK();
          *piStack_198 = *piStack_198 + -1;
          UNLOCK();
          if (*piStack_198 == 0) {
            if (local_180 == (Allocator *)0x0) {
              if (local_1a0 != (Allocator *)0x0) {
                free(local_1a0);
              }
            }
            else {
              (*local_180->_vptr_Allocator[3])();
            }
          }
        }
        piStack_198 = (int *)CONCAT44(uStack_22c,uStack_230);
        local_1a0 = local_238;
        local_190 = CONCAT44(uStack_224,local_228);
        local_188 = local_220;
        local_180 = local_218;
        local_178 = CONCAT44(iStack_20c,uStack_210);
        uStack_170 = CONCAT44(uStack_204,uStack_208);
        local_168 = uStack_200;
        local_160 = local_1f8;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) != 0)
        {
          local_328.cstep = 0;
          local_328.data = (Allocator *)0x0;
          local_328.refcount._0_4_ = 0;
          local_328.refcount._4_4_ = 0;
          local_328.elemsize = 0;
          local_328.elempack = 0;
          local_328.h = 0;
          local_328.allocator = (Allocator *)local_328.data;
          local_328.dims = (int)local_328.refcount;
          local_328.w = local_328.elempack;
          local_328.d = (int)local_328.refcount;
          local_328.c = local_328.elempack;
          Mat::create(&local_328,i,4,(Allocator *)0x0);
          auVar10 = _DAT_00316320;
          auVar9 = _DAT_00316300;
          uVar11 = local_328.c * (int)local_328.cstep;
          auVar35._8_8_ = uStack_50;
          auVar35._0_8_ = local_58;
          auVar36 = vpcmpeqd_avx(auVar36,auVar36);
          if (0 < (int)uVar11) {
            auVar23._8_8_ = 0;
            auVar23._0_8_ = (ulong)uVar11 - 1;
            auVar22 = vpshufd_avx(auVar23,0x44);
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) + lVar19 * 4);
            auVar25._4_4_ = uVar1;
            auVar25._0_4_ = uVar1;
            auVar25._8_4_ = uVar1;
            auVar25._12_4_ = uVar1;
            auVar25._16_4_ = uVar1;
            auVar25._20_4_ = uVar1;
            auVar25._24_4_ = uVar1;
            auVar25._28_4_ = uVar1;
            uVar16 = 0;
            do {
              auVar27._8_8_ = 0;
              auVar27._0_8_ = uVar16;
              auVar8 = vpshufd_avx(auVar27,0x44);
              auVar29._16_16_ = auVar8;
              auVar29._0_16_ = auVar8;
              auVar26 = vorps_avx(auVar9,auVar29);
              auVar32 = vorps_avx(auVar10,auVar29);
              auVar8 = vpcmpgtq_avx(auVar35 ^ auVar32._16_16_,auVar35 ^ auVar22);
              auVar24 = vpcmpgtq_avx(auVar35 ^ auVar32._0_16_,auVar35 ^ auVar22);
              auVar8 = vpackssdw_avx(auVar24,auVar8);
              auVar24 = vpcmpgtq_avx(auVar35 ^ auVar26._16_16_,auVar35 ^ auVar22);
              auVar33._0_4_ = (uint)local_58 ^ auVar26._0_4_;
              auVar33._4_4_ = (uint)((ulong)local_58 >> 0x20) ^ auVar26._4_4_;
              auVar33._8_4_ = (uint)uStack_50 ^ auVar26._8_4_;
              auVar33._12_4_ = (uint)((ulong)uStack_50 >> 0x20) ^ auVar26._12_4_;
              auVar28 = vpcmpgtq_avx(auVar33,auVar35 ^ auVar22);
              auVar24 = vpackssdw_avx(auVar28,auVar24);
              auVar8 = vpackssdw_avx(auVar36 ^ auVar24,auVar36 ^ auVar8);
              auVar24 = vpmovsxwd_avx(auVar8);
              auVar8 = vpunpckhwd_avx(auVar8,auVar8);
              auVar30._16_16_ = auVar8;
              auVar30._0_16_ = auVar24;
              auVar26 = vmaskmovps_avx(auVar30,auVar25);
              *(undefined1 (*) [32])((long)(_func_int ***)local_328.data + uVar16 * 4) = auVar26;
              uVar16 = uVar16 + 8;
            } while ((uVar11 + 7 & 0xfffffff8) != uVar16);
          }
          piVar5 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          if (piStack_150 != (int *)0x0) {
            LOCK();
            *piStack_150 = *piStack_150 + -1;
            UNLOCK();
            if (*piStack_150 == 0) {
              if (local_138 == (Allocator *)0x0) {
                if (local_158 != (Allocator *)0x0) {
                  free(local_158);
                }
              }
              else {
                (*local_138->_vptr_Allocator[3])();
              }
            }
          }
          piStack_150 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
          local_158 = (Allocator *)local_328.data;
          local_148 = local_328.elemsize;
          local_140 = local_328.elempack;
          local_138 = local_328.allocator;
          local_130 = CONCAT44(local_328.w,local_328.dims);
          uStack_128 = CONCAT44(local_328.d,local_328.h);
          local_120 = local_328.c;
          local_118 = local_328.cstep;
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          local_2c8 = *(size_t *)(&this->field_0x250 + (long)p_Var13);
          local_2d8 = (Allocator *)
                      (local_2c8 * lVar19 + *(long *)(&this->field_0x240 + (long)p_Var13));
          local_2c0 = *(uint *)(&this->field_0x258 + (long)p_Var13);
          local_2b8 = *(Allocator **)(&this->field_0x260 + (long)p_Var13);
          local_2d0 = (int *)0x0;
          local_2b0 = 1;
          uStack_2ac = 1;
          uStack_2a8 = 1;
          uStack_2a4 = 1;
          local_2a0 = 1;
          local_298 = 1;
          if (piStack_108 != (int *)0x0) {
            LOCK();
            *piStack_108 = *piStack_108 + -1;
            UNLOCK();
            if (*piStack_108 == 0) {
              if (local_f0 == (Allocator *)0x0) {
                if (local_110 != (Allocator *)0x0) {
                  free(local_110);
                }
              }
              else {
                (*local_f0->_vptr_Allocator[3])();
              }
            }
          }
          local_110 = local_2d8;
          piStack_108 = local_2d0;
          sStack_100 = local_2c8;
          uStack_f8 = local_2c0;
          local_f0 = local_2b8;
          local_e8 = CONCAT44(uStack_2ac,local_2b0);
          uStack_e0 = CONCAT44(uStack_2a4,uStack_2a8);
          local_d8 = local_2a0;
          local_d0 = local_298;
          if (local_2d0 != (int *)0x0) {
            LOCK();
            *local_2d0 = *local_2d0 + -1;
            UNLOCK();
            if (*local_2d0 == 0) {
              if (local_2b8 == (Allocator *)0x0) {
                if (local_2d8 != (Allocator *)0x0) {
                  free(local_2d8);
                }
              }
              else {
                (*local_2b8->_vptr_Allocator[3])();
              }
            }
          }
          piVar5 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_328.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_328.data != (Allocator *)0x0) {
                  free(local_328.data);
                }
              }
              else {
                (*(local_328.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          if (100 < *(int *)(&this->field_0x10c + (long)p_Var13)) {
            local_328.elemsize = *(size_t *)(&this->field_0x298 + (long)p_Var13);
            local_328.data =
                 (void *)(local_328.elemsize * lVar19 +
                         *(long *)(&this->field_0x288 + (long)p_Var13));
            local_328.elempack = *(int *)(&this->field_0x2a0 + (long)p_Var13);
            local_328.allocator = *(Allocator **)(&this->field_0x2a8 + (long)p_Var13);
            local_328.refcount._0_4_ = 0;
            local_328.refcount._4_4_ = 0;
            local_328.dims = 1;
            local_328.w = 1;
            local_328.h = 1;
            local_328.d = 1;
            local_328.c = 1;
            local_328.cstep = 1;
            if (piStack_c0 != (int *)0x0) {
              LOCK();
              *piStack_c0 = *piStack_c0 + -1;
              UNLOCK();
              if (*piStack_c0 == 0) {
                if (local_a8 == (Allocator *)0x0) {
                  if (local_c8 != (Allocator *)0x0) {
                    free(local_c8);
                  }
                }
                else {
                  (*local_a8->_vptr_Allocator[3])();
                }
              }
            }
            piVar5 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
            local_c8 = (Allocator *)local_328.data;
            piStack_c0 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
            sStack_b8 = local_328.elemsize;
            uStack_b0 = local_328.elempack;
            local_a8 = local_328.allocator;
            local_a0 = CONCAT44(local_328.w,local_328.dims);
            uStack_98 = CONCAT44(local_328.d,local_328.h);
            local_90 = local_328.c;
            local_88 = local_328.cstep;
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_328.allocator == (Allocator *)0x0) {
                  if ((Allocator *)local_328.data != (Allocator *)0x0) {
                    free(local_328.data);
                  }
                }
                else {
                  (*(local_328.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
        }
        in_ZMM10 = ZEXT1664(auVar35);
        in_ZMM11 = ZEXT1664(auVar36);
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_328,&local_1e8);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_328);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_328);
        lVar15 = 0x120;
        do {
          piVar5 = *(int **)((long)&local_1e8.refcount + lVar15);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar6 = *(void **)((long)&local_1e8.data + lVar15);
              plVar7 = *(long **)((long)&local_1e8.allocator + lVar15);
              if (plVar7 == (long *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (**(code **)(*plVar7 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_1e8.cstep + lVar15) = 0;
          *(undefined8 *)((long)&local_1e8.refcount + lVar15 + 4) = 0;
          *(undefined8 *)((long)&local_1e8.elemsize + lVar15 + 4) = 0;
          *(undefined8 *)((long)&local_1e8.data + lVar15) = 0;
          *(undefined8 *)((long)&local_1e8.refcount + lVar15) = 0;
          *(undefined8 *)((long)&local_1e8.dims + lVar15) = 0;
          *(undefined8 *)((long)&local_1e8.h + lVar15) = 0;
          *(undefined4 *)((long)&local_1e8.c + lVar15) = 0;
          lVar15 = lVar15 + -0x48;
        } while (lVar15 != -0x48);
      }
      (*pLVar14->_vptr_Layer[4])(pLVar14,local_60);
      (local_240->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar19] = pLVar14;
      ParamDict::~ParamDict(&local_40);
      piVar5 = (int *)CONCAT44(uStack_22c,uStack_230);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_218 == (Allocator *)0x0) {
            if (local_238 != (Allocator *)0x0) {
              free(local_238);
            }
          }
          else {
            (*local_218->_vptr_Allocator[3])();
          }
        }
      }
      if (piStack_280 != (int *)0x0) {
        LOCK();
        *piStack_280 = *piStack_280 + -1;
        UNLOCK();
        if (*piStack_280 == 0) {
          if (local_268 == (Allocator *)0x0) {
            if (local_288 != (void *)0x0) {
              free(local_288);
            }
          }
          else {
            (*local_268->_vptr_Allocator[3])();
          }
        }
      }
      lVar19 = lVar19 + 1;
      p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
    } while (lVar19 < *(int *)(&this->field_0x108 + (long)p_Var13));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}